

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

long testIdentifyType(int count)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  string messageString;
  Heartbeat message;
  string local_208;
  timeval local_1e8;
  FieldBase local_1d8;
  Heartbeat local_180;
  
  FIX42::Heartbeat::Heartbeat(&local_180);
  FIX::Message::toString_abi_cxx11_((int)&local_208,(int)&local_180,8);
  gettimeofday(&local_1e8,(__timezone_ptr_t)0x0);
  _Var2 = local_1e8.tv_usec;
  _Var1 = local_1e8.tv_sec;
  if (0 < count) {
    do {
      FIX::identifyType((MsgType *)&local_1d8,&local_208);
      FIX::FieldBase::~FieldBase(&local_1d8);
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday(&local_1e8,(__timezone_ptr_t)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  FIX::Message::~Message((Message *)&local_180);
  return (local_1e8.tv_usec - (_Var2 + (long)((double)_Var1 * 1000000.0))) +
         (long)((double)local_1e8.tv_sec * 1000000.0);
}

Assistant:

long testIdentifyType(int count) {
  FIX42::Heartbeat message;
  std::string messageString = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::identifyType(messageString);
  }

  return GetTickCount() - start;
}